

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::reset(lzcompressor *this)

{
  coding_stats *in_RDI;
  search_accelerator *unaff_retaddr;
  state *in_stack_00000010;
  lzcompressor *in_stack_00000018;
  coding_stats *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (*(long *)(in_RDI->m_match_truncation_len_hist + 3) < 0) {
    bVar1 = false;
  }
  else {
    this_00 = in_RDI;
    search_accelerator::reset(unaff_retaddr);
    lzham::symbol_codec::reset();
    coding_stats::clear(this_00);
    in_RDI->m_match_truncation_len_hist[3] = 0;
    in_RDI->m_match_truncation_len_hist[4] = 0;
    in_RDI->m_match_truncation_len_hist[5] = 1;
    vector<unsigned_char>::try_resize
              ((vector<unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (uint)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
    vector<unsigned_char>::try_resize
              ((vector<unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (uint)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
    in_RDI[1].m_match_truncation_hist[0x43] = 0;
    *(undefined1 *)(in_RDI[1].m_match_truncation_hist + 0x46) = 0;
    in_RDI[1].m_match_truncation_hist[0x44] = 0;
    in_RDI[1].m_match_truncation_hist[0x45] = 0;
    state::reset(in_stack_00000010);
    if ((*(int *)&in_RDI->m_worst_match_bits_cost == 0) ||
       (bVar1 = init_seed_bytes((lzcompressor *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
       bVar1)) {
      bVar1 = send_zlib_header(in_stack_00000018);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool lzcompressor::reset()
   {
      if (m_src_size < 0)
         return false;

      m_accel.reset();
      m_codec.reset();
      m_stats.clear();
      m_src_size = 0;
      m_src_adler32 = cInitAdler32;
      m_block_buf.try_resize(0);
      m_comp_buf.try_resize(0);

      m_step = 0;
      m_finished = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.reset();

      if (m_params.m_num_seed_bytes)
      {
         if (!init_seed_bytes())
         {
            LZHAM_LOG_ERROR(7012);
            return false;
         }
      }

      return send_zlib_header();
   }